

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_bwt_n.hpp
# Opt level: O3

void __thiscall
dna_bwt_n<dna_string_n>::next_leaves
          (dna_bwt_n<dna_string_n> *this,sa_leaf *L,
          vector<sa_leaf,_std::allocator<sa_leaf>_> *TMP_LEAVES,int *t,int min_n_children)

{
  pointer psVar1;
  long lVar2;
  uint64_t uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  p_range_n ext;
  p_range_n local_80;
  
  *t = 0;
  LF(&local_80,this,L->rn);
  uVar3 = L->depth + 1;
  uVar5 = (ulong)min_n_children;
  iVar4 = *t;
  iVar6 = iVar4;
  if (uVar5 <= local_80.A.second - local_80.A.first) {
    iVar6 = iVar4 + 1;
    *t = iVar6;
    psVar1 = (TMP_LEAVES->super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>)._M_impl.
             super__Vector_impl_data._M_start;
    psVar1[iVar4].rn.first = local_80.A.first;
    psVar1[iVar4].rn.second = local_80.A.second;
    psVar1[iVar4].depth = uVar3;
  }
  iVar4 = iVar6;
  if (uVar5 <= local_80.C.second - local_80.C.first) {
    iVar4 = iVar6 + 1;
    *t = iVar4;
    psVar1 = (TMP_LEAVES->super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>)._M_impl.
             super__Vector_impl_data._M_start;
    psVar1[iVar6].rn.first = local_80.C.first;
    psVar1[iVar6].rn.second = local_80.C.second;
    psVar1[iVar6].depth = uVar3;
  }
  iVar6 = iVar4;
  if (uVar5 <= local_80.G.second - local_80.G.first) {
    iVar6 = iVar4 + 1;
    *t = iVar6;
    psVar1 = (TMP_LEAVES->super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>)._M_impl.
             super__Vector_impl_data._M_start;
    psVar1[iVar4].rn.first = local_80.G.first;
    psVar1[iVar4].rn.second = local_80.G.second;
    psVar1[iVar4].depth = uVar3;
  }
  iVar4 = iVar6;
  if (uVar5 <= local_80.N.second - local_80.N.first) {
    iVar4 = iVar6 + 1;
    *t = iVar4;
    psVar1 = (TMP_LEAVES->super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>)._M_impl.
             super__Vector_impl_data._M_start;
    psVar1[iVar6].rn.first = local_80.N.first;
    psVar1[iVar6].rn.second = local_80.N.second;
    psVar1[iVar6].depth = uVar3;
  }
  iVar6 = iVar4;
  if (uVar5 <= local_80.T.second - local_80.T.first) {
    iVar6 = iVar4 + 1;
    *t = iVar6;
    psVar1 = (TMP_LEAVES->super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>)._M_impl.
             super__Vector_impl_data._M_start;
    psVar1[iVar4].rn.first = local_80.T.first;
    psVar1[iVar4].rn.second = local_80.T.second;
    psVar1[iVar4].depth = uVar3;
  }
  if (iVar6 != 0) {
    uVar5 = (ulong)iVar6;
    psVar1 = (TMP_LEAVES->super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<sa_leaf*,std::vector<sa_leaf,std::allocator<sa_leaf>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dna_bwt_n<dna_string_n>::next_leaves(sa_leaf&,std::vector<sa_leaf,std::allocator<sa_leaf>>&,int&,int)::_lambda(sa_leaf_const&,sa_leaf_const&)_1_>>
              (psVar1,psVar1 + uVar5,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<sa_leaf*,std::vector<sa_leaf,std::allocator<sa_leaf>>>,__gnu_cxx::__ops::_Iter_comp_iter<dna_bwt_n<dna_string_n>::next_leaves(sa_leaf&,std::vector<sa_leaf,std::allocator<sa_leaf>>&,int&,int)::_lambda(sa_leaf_const&,sa_leaf_const&)_1_>>
              (psVar1,psVar1 + uVar5);
  }
  return;
}

Assistant:

void next_leaves(sa_leaf & L, vector<sa_leaf> & TMP_LEAVES, int & t, int min_n_children){

		t = 0;

		p_range_n ext = LF(L.rn);

		sa_leaf A = {ext.A, L.depth+1};
		sa_leaf C = {ext.C, L.depth+1};
		sa_leaf G = {ext.G, L.depth+1};
		sa_leaf N = {ext.N, L.depth+1};
		sa_leaf T = {ext.T, L.depth+1};

		if(leaf_size(A)>=min_n_children) TMP_LEAVES[t++] = A;
		if(leaf_size(C)>=min_n_children) TMP_LEAVES[t++] = C;
		if(leaf_size(G)>=min_n_children) TMP_LEAVES[t++] = G;
		if(leaf_size(N)>=min_n_children) TMP_LEAVES[t++] = N;
		if(leaf_size(T)>=min_n_children) TMP_LEAVES[t++] = T;

		std::sort( TMP_LEAVES.begin(), TMP_LEAVES.begin()+t, [ ]( const sa_leaf& lhs, const sa_leaf& rhs )
		{
			return leaf_size(lhs) < leaf_size(rhs);
		});

	}